

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O3

_Fwd_list_const_iterator<int> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::dummy_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> first,_Fwd_list_const_iterator<int> last,
          bitmask_type *hint)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if (first._M_node != last._M_node) {
    uVar3 = 0;
    do {
      lVar2 = *(long *)this;
      if (*(ulong *)(lVar2 + 0x30) <= uVar3) {
        return (_Fwd_list_const_iterator<int>)first._M_node;
      }
      lVar5 = *(long *)(lVar2 + 0x10);
      if (lVar5 == 0) {
LAB_001fbf90:
        uVar4 = 0;
      }
      else {
        iVar1 = *(int *)&first._M_node[1]._M_next;
        lVar6 = lVar2 + 8;
        do {
          if (iVar1 <= *(int *)(lVar5 + 0x20)) {
            lVar6 = lVar5;
          }
          lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < iVar1) * 8);
        } while (lVar5 != 0);
        if ((lVar6 == lVar2 + 8) || (iVar1 < *(int *)(lVar6 + 0x20))) goto LAB_001fbf90;
        uVar4 = (uint)*(undefined8 *)(lVar6 + 0x28);
      }
      (hint->super__Base_bitset<1UL>)._M_w =
           (ulong)(uVar4 & (int)(hint->super__Base_bitset<1UL>)._M_w * 2 + 1U);
      first._M_node = (first._M_node)->_M_next;
      uVar3 = uVar3 + 1;
    } while (first._M_node != last._M_node);
  }
  return (_Fwd_list_const_iterator<int>)first._M_node;
}

Assistant:

ForwardIterator
                dummy_search
                (
                    ForwardIterator first,
                    ForwardIterator last,
                    bitmask_type & hint
                ) const
            {
                auto dummy_iteration_count = std::size_t{0};
                while (first != last && dummy_iteration_count < m_bitmask_table->length())
                {
                    hint = bit_shift(hint) & (*m_bitmask_table)[*first];

                    ++first;
                    ++dummy_iteration_count;
                }

                return first;
            }